

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O3

ssize_t __thiscall
trial::protocol::buffer::basic_container<std::vector<char,_std::allocator<char>_>_>::write
          (basic_container<std::vector<char,_std::allocator<char>_>_> *this,int __fd,void *__buf,
          size_t __n)

{
  int iVar1;
  undefined4 extraout_var;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  long *plVar2;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (*(this->super_base<char>)._vptr_base[2])(this,*plVar2);
  if ((char)iVar1 != '\0') {
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              ((vector<char,std::allocator<char>> *)this->buffer,
               *(undefined8 *)((vector<char,std::allocator<char>> *)this->buffer + 8),plVar2[1],
               *plVar2 + plVar2[1]);
    return extraout_RAX;
  }
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

virtual void write(const view_type& view)
    {
        if (grow(view.size()))
        {
            buffer.insert(buffer.end(), view.begin(), view.end());
        }
    }